

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O1

_Bool project_aimed(source origin,wchar_t typ,wchar_t dir,wchar_t dam,wchar_t flg,object *obj)

{
  _Bool _Var1;
  uint32_t uVar2;
  monster *pmVar3;
  wchar_t wVar4;
  int iVar5;
  source origin_00;
  loc grid;
  
  origin_00.which = origin.which;
  origin_00.what = origin.what;
  grid = (loc)loc(-1,-1);
  wVar4 = flg | 4;
  if (origin_00.what == SRC_PLAYER) {
    if ((dir == L'\x05') && (_Var1 = target_okay(), _Var1)) {
      target_get((loc_conflict *)&grid);
    }
    else {
      grid = (loc)loc_sum(player->grid,(loc_conflict)ddgrid[dir]);
    }
    goto LAB_0013955b;
  }
  if (origin_00.what == SRC_MONSTER) {
    pmVar3 = cave_monster(cave,origin.which._0_4_);
    if (pmVar3 == (monster *)0x0) goto LAB_0013955b;
    wVar4 = monster_effect_level(pmVar3,L'\x02');
    iVar5 = 100;
    for (; wVar4 != L'\0'; wVar4 = wVar4 + L'\xffffffff') {
      iVar5 = (iVar5 * 0x3c) / 100;
    }
    uVar2 = Rand_div(100);
    if ((int)uVar2 < iVar5) {
      wVar4 = (pmVar3->target).midx;
      if (wVar4 < L'\x01') {
        _Var1 = monster_is_decoyed(pmVar3);
        if (!_Var1) goto LAB_001394fa;
        grid = cave_find_decoy(cave);
      }
      else {
        pmVar3 = cave_monster(cave,wVar4);
        grid.x = (pmVar3->grid).x;
        grid.y = (pmVar3->grid).y;
      }
    }
    else {
      uVar2 = Rand_div(9);
      grid = (loc)loc_sum(pmVar3->grid,(loc_conflict)ddgrid[(long)(int)uVar2 + 1]);
    }
  }
  else {
LAB_001394fa:
    grid.x = (player->grid).x;
    grid.y = (player->grid).y;
  }
  wVar4 = flg | 0x804;
LAB_0013955b:
  origin_00._4_4_ = 0;
  _Var1 = project(origin_00,L'\0',grid,dam,typ,wVar4,L'\0','\0',obj);
  return _Var1;
}

Assistant:

static bool project_aimed(struct source origin,
						  int typ, int dir, int dam, int flg,
						  const struct object *obj)
{
	struct loc grid = loc(-1, -1);

	/* Pass through the target if needed */
	flg |= (PROJECT_THRU);

	get_target(origin, dir, &grid, &flg);

	/* Aim at the target, do NOT explode */
	return (project(origin, 0, grid, dam, typ, flg, 0, 0, obj));
}